

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

ktx_error_code_e printKTX2Info2(ktxStream *stream,KTX_header2 *pHeader)

{
  uint32_t dataSize;
  ktx_uint32_t kVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  ktx_error_code_e kVar4;
  ktx_error_code_e kVar5;
  ktxLevelIndexEntry *levelIndex;
  uint32_t *DFD;
  ktx_uint8_t *pKvd;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ktx_error_code_e kVar12;
  ulong uVar13;
  ktx_uint32_t kVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  uint uVar25;
  long lVar26;
  undefined1 in_XMM8 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if ((pHeader->dataFormatDescriptor).byteOffset == 0) {
    bVar15 = false;
  }
  else {
    bVar15 = (pHeader->dataFormatDescriptor).byteLength != 0;
  }
  if ((pHeader->keyValueData).byteOffset == 0) {
    bVar16 = false;
  }
  else {
    bVar16 = (pHeader->keyValueData).byteLength != 0;
  }
  if ((pHeader->supercompressionGlobalData).byteOffset == 0) {
    bVar17 = false;
  }
  else {
    bVar17 = (pHeader->supercompressionGlobalData).byteLength != 0;
  }
  fwrite("Header\n\n",8,1,_stdout);
  printKTX2Header(pHeader);
  fwrite("\nLevel Index\n\n",0xe,1,_stdout);
  kVar14 = pHeader->levelCount + (uint)(pHeader->levelCount == 0);
  uVar13 = (ulong)(kVar14 * 0x18);
  levelIndex = (ktxLevelIndexEntry *)malloc(uVar13);
  kVar5 = KTX_OUT_OF_MEMORY;
  if (levelIndex == (ktxLevelIndexEntry *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  kVar4 = (*stream->read)(stream,levelIndex,uVar13);
  if (kVar4 == KTX_SUCCESS) {
    printLevelIndex(levelIndex,kVar14);
    free(levelIndex);
    if (bVar15) {
      fwrite("\nData Format Descriptor\n\n",0x19,1,_stdout);
      uVar13 = (ulong)(pHeader->dataFormatDescriptor).byteLength;
      DFD = (uint32_t *)malloc(uVar13);
      if (DFD == (uint32_t *)0x0) {
        kVar5 = KTX_OUT_OF_MEMORY;
        bVar15 = false;
        kVar4 = KTX_SUCCESS;
      }
      else {
        kVar5 = (*stream->read)(stream,DFD,uVar13);
        kVar4 = KTX_SUCCESS;
        if (kVar5 == KTX_SUCCESS) {
          dataSize = (pHeader->dataFormatDescriptor).byteLength;
          if (*DFD == dataSize) {
            printDFD(DFD,dataSize);
            bVar15 = true;
            kVar5 = KTX_OUT_OF_MEMORY;
          }
          else {
            kVar5 = KTX_FILE_DATA_ERROR;
            bVar15 = false;
          }
        }
        else {
          bVar15 = false;
          kVar4 = kVar5;
        }
        free(DFD);
      }
      if (!bVar15) {
        return kVar5;
      }
    }
    else {
      kVar4 = KTX_SUCCESS;
    }
    if (bVar16) {
      fwrite("\nKey/Value Data\n\n",0x11,1,_stdout);
      uVar13 = (ulong)(pHeader->keyValueData).byteLength;
      pKvd = (ktx_uint8_t *)malloc(uVar13);
      if (pKvd == (ktx_uint8_t *)0x0) {
        kVar12 = KTX_OUT_OF_MEMORY;
        bVar15 = false;
      }
      else {
        kVar4 = (*stream->read)(stream,pKvd,uVar13);
        bVar15 = kVar4 == KTX_SUCCESS;
        kVar12 = kVar4;
        if (bVar15) {
          printKVData(pKvd,(pHeader->keyValueData).byteLength);
          kVar4 = KTX_SUCCESS;
          kVar12 = kVar5;
        }
        free(pKvd);
      }
      if (!bVar15) {
        return kVar12;
      }
    }
    else {
      fwrite("\nNo Key/Value data.\n",0x14,1,_stdout);
    }
    if (!bVar17) {
      return kVar4;
    }
    if (pHeader->supercompressionScheme != 1) {
      fwrite("\nUnrecognized supercompressionScheme.\n",0x26,1,_stdout);
      return kVar4;
    }
    levelIndex = (ktxLevelIndexEntry *)malloc((pHeader->supercompressionGlobalData).byteLength);
    if (levelIndex == (ktxLevelIndexEntry *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
    kVar4 = (*stream->setpos)(stream,(pHeader->supercompressionGlobalData).byteOffset);
    if ((kVar4 == KTX_SUCCESS) &&
       (kVar4 = (*stream->read)(stream,levelIndex,(pHeader->supercompressionGlobalData).byteLength),
       kVar4 == KTX_SUCCESS)) {
      kVar14 = pHeader->layerCount;
      kVar1 = pHeader->faceCount;
      uVar6 = pHeader->pixelDepth + (uint)(pHeader->pixelDepth == 0);
      uVar9 = pHeader->levelCount;
      if (1 < uVar9) {
        uVar10 = uVar9 - 2;
        auVar21._4_4_ = uVar6;
        auVar21._0_4_ = uVar6;
        auVar21._8_4_ = uVar6;
        auVar21._12_4_ = uVar6;
        auVar20 = ZEXT416(uVar6);
        auVar23 = _DAT_001e9a80;
        iVar7 = 4;
        do {
          auVar19 = auVar20;
          auVar20 = pshuflw(auVar19,auVar23,0xfe);
          uVar25 = uVar6 >> auVar20._0_8_;
          auVar20 = pshuflw(in_XMM8,auVar23,0x54);
          uVar18 = uVar6 >> auVar20._0_8_;
          iVar8 = auVar23._4_4_;
          iVar11 = auVar23._8_4_;
          iVar24 = auVar23._12_4_;
          auVar27._0_8_ = auVar23._8_8_;
          auVar27._8_4_ = iVar11;
          auVar27._12_4_ = iVar24;
          auVar20 = pshuflw(in_XMM9,auVar27,0xfe);
          lVar26 = auVar20._0_8_;
          auVar2._4_8_ = auVar21._8_8_;
          auVar2._0_4_ = uVar6 >> lVar26;
          auVar29._0_8_ = auVar2._0_8_ << 0x20;
          auVar29._8_4_ = uVar6 >> lVar26;
          auVar29._12_4_ = uVar6 >> lVar26;
          in_XMM8 = pshuflw(auVar27,auVar27,0x54);
          lVar26 = in_XMM8._0_8_;
          auVar3._4_8_ = auVar21._8_8_;
          auVar3._0_4_ = uVar6 >> lVar26;
          auVar28._0_8_ = auVar3._0_8_ << 0x20;
          auVar28._8_4_ = uVar6 >> lVar26;
          auVar28._12_4_ = uVar6 >> lVar26;
          in_XMM9._8_8_ = auVar29._8_8_;
          in_XMM9._0_8_ = auVar28._8_8_;
          auVar20._0_4_ = uVar18 + (uVar18 == 0) + auVar19._0_4_;
          auVar20._4_4_ = uVar25 + (uVar25 == 0) + auVar19._4_4_;
          auVar20._8_4_ = auVar28._8_4_ + (auVar28._8_4_ == 0) + auVar19._8_4_;
          auVar20._12_4_ = auVar29._12_4_ + (auVar29._12_4_ == 0) + auVar19._12_4_;
          auVar23._0_4_ = auVar23._0_4_ + 4;
          auVar23._4_4_ = iVar8 + 4;
          auVar23._8_4_ = iVar11 + 4;
          auVar23._12_4_ = iVar24 + 4;
          iVar8 = iVar7 + -4;
          iVar11 = iVar7 + (uVar9 + 2 & 0xfffffffc);
          iVar7 = iVar8;
        } while (iVar11 != 8);
        uVar9 = -iVar8;
        auVar22._0_4_ = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
        auVar22._4_4_ = -(uint)((int)(uVar10 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
        auVar22._8_4_ = -(uint)((int)(uVar10 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
        auVar22._12_4_ = -(uint)((int)(uVar10 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
        auVar20 = ~auVar22 & auVar20 | auVar19 & auVar22;
        uVar6 = auVar20._12_4_ + auVar20._4_4_ + auVar20._8_4_ + auVar20._0_4_;
      }
      fwrite("\nBasis Supercompression Global Data\n\n",0x25,1,_stdout);
      printBasisSGDInfo((ktx_uint8_t *)levelIndex,(pHeader->supercompressionGlobalData).byteLength,
                        (kVar14 + (kVar14 == 0)) * kVar1 * uVar6);
      free(levelIndex);
      return KTX_SUCCESS;
    }
  }
  free(levelIndex);
  return kVar4;
}

Assistant:

KTX_error_code
printKTX2Info2(ktxStream* stream, KTX_header2* pHeader)
{
    const bool hasDFD =
            pHeader->dataFormatDescriptor.byteOffset != 0 &&
            pHeader->dataFormatDescriptor.byteLength != 0;
    const bool hasKVD =
            pHeader->keyValueData.byteOffset != 0 &&
            pHeader->keyValueData.byteLength != 0;
    const bool hasSGD =
            pHeader->supercompressionGlobalData.byteOffset != 0 &&
            pHeader->supercompressionGlobalData.byteLength != 0;

    ktx_uint32_t numLevels;
    ktxLevelIndexEntry* levelIndex;
    ktx_uint32_t levelIndexSize;
    KTX_error_code ec = KTX_SUCCESS;

    fprintf(stdout, "Header\n\n");
    printKTX2Header(pHeader);

    fprintf(stdout, "\nLevel Index\n\n");
    numLevels = MAX(1, pHeader->levelCount);
    levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    levelIndex = (ktxLevelIndexEntry*)malloc(levelIndexSize);
    if (levelIndex == NULL)
        return KTX_OUT_OF_MEMORY;
    ec = stream->read(stream, levelIndex, levelIndexSize);
    if (ec != KTX_SUCCESS) {
        free(levelIndex);
        return ec;
    }
    printLevelIndex(levelIndex, numLevels);
    free(levelIndex);

    if (hasDFD) {
        fprintf(stdout, "\nData Format Descriptor\n\n");
        ktx_uint32_t* dfd = (ktx_uint32_t*)malloc(pHeader->dataFormatDescriptor.byteLength);
        if (dfd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, dfd, pHeader->dataFormatDescriptor.byteLength);
        if (ec != KTX_SUCCESS) {
            free(dfd);
            return ec;
        }
        if (*dfd != pHeader->dataFormatDescriptor.byteLength) {
            free(dfd);
            return KTX_FILE_DATA_ERROR;
        }
        printDFD(dfd, pHeader->dataFormatDescriptor.byteLength);
        free(dfd);
    }

    if (hasKVD) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        ktx_uint8_t* kvd = malloc(pHeader->keyValueData.byteLength);
        if (kvd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, kvd, pHeader->keyValueData.byteLength);
        if (ec != KTX_SUCCESS) {
            free(kvd);
            return ec;
        }
        printKVData(kvd, pHeader->keyValueData.byteLength);
        free(kvd);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    if (hasSGD) {
        if (pHeader->supercompressionScheme == KTX_SS_BASIS_LZ) {
            ktx_uint8_t* sgd = malloc(pHeader->supercompressionGlobalData.byteLength);
            if (sgd == NULL)
                return KTX_OUT_OF_MEMORY;
            ec = stream->setpos(stream, pHeader->supercompressionGlobalData.byteOffset);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            ec = stream->read(stream, sgd, pHeader->supercompressionGlobalData.byteLength);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            //
            // Calculate number of images
            //
            uint32_t layersFaces = MAX(pHeader->layerCount, 1) * pHeader->faceCount;
            uint32_t layerPixelDepth = MAX(pHeader->pixelDepth, 1);
            for(uint32_t level = 1; level < MAX(pHeader->levelCount, 1); level++)
                layerPixelDepth += MAX(MAX(pHeader->pixelDepth, 1) >> level, 1U);
            // NOTA BENE: faceCount * layerPixelDepth is only reasonable because
            // faceCount and depth can't both be > 1. I.e there are no 3d cubemaps.
            uint32_t numImages = layersFaces * layerPixelDepth;
            fprintf(stdout, "\nBasis Supercompression Global Data\n\n");
            printBasisSGDInfo(sgd, pHeader->supercompressionGlobalData.byteLength, numImages);
            free(sgd);
        } else {
            fprintf(stdout, "\nUnrecognized supercompressionScheme.\n");
        }
    }

    return ec;
}